

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O2

void Abc_NtkManRefStop(Abc_ManRef_t *p)

{
  Vec_Ptr_t *p_00;
  Vec_Int_t *__ptr;
  Vec_Str_t *__ptr_00;
  void *__ptr_01;
  int i;
  int i_00;
  
  p_00 = p->vFuncs;
  if (p_00 != (Vec_Ptr_t *)0x0) {
    for (i_00 = 0; i_00 < p_00->nSize; i_00 = i_00 + 1) {
      __ptr_01 = Vec_PtrEntry(p_00,i_00);
      if ((void *)0x2 < __ptr_01) {
        free(__ptr_01);
      }
    }
    Vec_PtrFree(p_00);
  }
  Vec_PtrFree(p->vVars);
  __ptr = p->vMemory;
  free(__ptr->pArray);
  free(__ptr);
  Vec_PtrFree(p->vVisited);
  __ptr_00 = p->vCube;
  free(__ptr_00->pArray);
  free(__ptr_00);
  free(p);
  return;
}

Assistant:

void Abc_NtkManRefStop( Abc_ManRef_t * p )
{
    Vec_PtrFreeFree( p->vFuncs );
    Vec_PtrFree( p->vVars );
    Vec_IntFree( p->vMemory );
    Vec_PtrFree( p->vVisited );
    Vec_StrFree( p->vCube );
    ABC_FREE( p );
}